

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

_Bool project_m_player_attack(project_monster_handler_context_t *context)

{
  wchar_t damage;
  wchar_t msg_code;
  monster *mon_00;
  byte local_2a;
  _Bool display_dam;
  monster *mon;
  mon_messages hurt_msg;
  mon_messages die_msg;
  wchar_t dam;
  _Bool seen;
  _Bool mon_died;
  _Bool fear;
  project_monster_handler_context_t *context_local;
  
  die_msg._3_1_ = MON_MSG_NONE >> 0x18;
  die_msg._2_1_ = MON_MSG_NONE >> 0x10;
  die_msg._1_1_ = context->seen & 1;
  damage = context->dam;
  mon._4_4_ = context->die_msg;
  msg_code = context->hurt_msg;
  mon_00 = context->mon;
  local_2a = 0;
  if ((context->origin).what == SRC_PLAYER) {
    local_2a = (player->opts).opt[3];
  }
  _dam = context;
  if (mon_00->hp < damage) {
    if (die_msg._1_1_ == MON_MSG_NONE >> 8) {
      mon._4_4_ = L'.';
    }
    if ((local_2a & 1) == 0) {
      add_monster_message(mon_00,mon._4_4_,false);
    }
    else {
      add_monster_message_show_damage(mon_00,mon._4_4_,false,damage);
    }
  }
  if (damage != L'\0') {
    die_msg._2_1_ = mon_take_hit(mon_00,player,damage,(_Bool *)((long)&die_msg + 3),"");
  }
  if ((die_msg._2_1_ & 1) == MON_MSG_NONE >> 0x10) {
    if ((local_2a & 1) == 0) {
      if (((die_msg._1_1_ & 1) == MON_MSG_NONE >> 8) || (msg_code == L'\0')) {
        if (L'\0' < damage) {
          message_pain(mon_00,damage);
        }
      }
      else {
        add_monster_message(mon_00,msg_code,false);
      }
    }
    else if (((die_msg._1_1_ & 1) == MON_MSG_NONE >> 8) || (msg_code == L'\0')) {
      if (L'\0' < damage) {
        message_pain_show_damage(mon_00,damage);
      }
    }
    else {
      add_monster_message_show_damage(mon_00,msg_code,false,damage);
    }
    if (((die_msg._1_1_ & 1) != MON_MSG_NONE >> 8) && ((die_msg._3_1_ & 1) != MON_MSG_NONE >> 0x18))
    {
      add_monster_message(mon_00,L'%',true);
    }
  }
  return (_Bool)(die_msg._2_1_ & 1);
}

Assistant:

static bool project_m_player_attack(project_monster_handler_context_t *context)
{
	bool fear = false;
	bool mon_died = false;
	bool seen = context->seen;
	int dam = context->dam;
	enum mon_messages die_msg = context->die_msg;
	enum mon_messages hurt_msg = context->hurt_msg;
	struct monster *mon = context->mon;
	bool display_dam = context->origin.what == SRC_PLAYER
		&& OPT(player, show_damage);

	/* The monster is going to be killed, so display a specific death message.
	 * If the monster is not visible to the player, use a generic message.
	 *
	 * Note that mon_take_hit() below is passed a zero-length string, which
	 * ensures it doesn't print any death message and allows correct ordering
	 * of messages. */
	if (dam > mon->hp) {
		if (!seen) die_msg = MON_MSG_MORIA_DEATH;
		if (display_dam) {
			add_monster_message_show_damage(mon, die_msg, false,
				dam);
		} else {
			add_monster_message(mon, die_msg, false);
		}
	}

	/* No damage is now going to mean the monster is not hit - and hence
	 * is not woken or released from holding */
	if (dam) {
		mon_died = mon_take_hit(mon, player, dam, &fear, "");
	}

	/* If the monster didn't die, provide additional messages about how it was
	 * hurt/damaged. If a specific message isn't provided, display a message
	 * based on the amount of damage dealt. Also display a message
	 * if the hit caused the monster to flee. */
	if (!mon_died) {
		if (display_dam) {
			if (seen && hurt_msg != MON_MSG_NONE) {
				add_monster_message_show_damage(mon, hurt_msg,
					false, dam);
			} else if (dam > 0) {
				message_pain_show_damage(mon, dam);
			}
		} else {
			if (seen && hurt_msg != MON_MSG_NONE) {
				add_monster_message(mon, hurt_msg, false);
			} else if (dam > 0) {
				message_pain(mon, dam);
			}
		}

		if (seen && fear)
			add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
	}

	return mon_died;
}